

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::js::Generator::GenerateClassSerializeBinary
          (Generator *this,GeneratorOptions *options,Printer *printer,Descriptor *desc)

{
  int iVar1;
  Descriptor *pDVar2;
  Printer *pPVar3;
  bool bVar4;
  int iVar5;
  FieldDescriptor *pFVar6;
  GeneratorOptions *options_00;
  GeneratorOptions *descriptor;
  Descriptor *in_R8;
  string local_98;
  string local_78;
  int local_58;
  int i;
  string local_48;
  GeneratorOptions *local_28;
  Descriptor *desc_local;
  Printer *printer_local;
  GeneratorOptions *options_local;
  Generator *this_local;
  
  local_28 = (GeneratorOptions *)desc;
  desc_local = (Descriptor *)printer;
  printer_local = (Printer *)options;
  options_local = (GeneratorOptions *)this;
  (anonymous_namespace)::GetMessagePath_abi_cxx11_
            (&local_48,(_anonymous_namespace_ *)options,(GeneratorOptions *)desc,desc);
  io::Printer::Print(printer,
                     "/**\n * Serializes the message to binary data (in protobuf wire format).\n * @return {!Uint8Array}\n */\n$class$.prototype.serializeBinary = function() {\n  var writer = new jspb.BinaryWriter();\n  $class$.serializeBinaryToWriter(this, writer);\n  return writer.getResultBuffer();\n};\n\n\n/**\n * Serializes the given message to binary data (in protobuf wire\n * format), writing to the given BinaryWriter.\n * @param {!$class$} message\n * @param {!jspb.BinaryWriter} writer\n */\n$class$.serializeBinaryToWriter = function(message, writer) {\n  var f = undefined;\n"
                     ,"class",&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  for (local_58 = 0; iVar1 = local_58, iVar5 = Descriptor::field_count((Descriptor *)local_28),
      iVar1 < iVar5; local_58 = local_58 + 1) {
    pFVar6 = Descriptor::field((Descriptor *)local_28,local_58);
    bVar4 = anon_unknown_0::IgnoreField(pFVar6);
    pPVar3 = printer_local;
    pDVar2 = desc_local;
    if (!bVar4) {
      pFVar6 = Descriptor::field((Descriptor *)local_28,local_58);
      GenerateClassSerializeBinaryField(this,(GeneratorOptions *)pPVar3,(Printer *)pDVar2,pFVar6);
    }
  }
  bVar4 = anon_unknown_0::IsExtendable((Descriptor *)local_28);
  pPVar3 = printer_local;
  pDVar2 = desc_local;
  if (bVar4) {
    options_00 = (GeneratorOptions *)Descriptor::file((Descriptor *)local_28);
    descriptor = local_28;
    (anonymous_namespace)::JSExtensionsObjectName_abi_cxx11_
              (&local_78,(_anonymous_namespace_ *)pPVar3,options_00,(FileDescriptor *)local_28,in_R8
              );
    (anonymous_namespace)::GetMessagePath_abi_cxx11_
              (&local_98,(_anonymous_namespace_ *)printer_local,local_28,(Descriptor *)descriptor);
    io::Printer::Print((Printer *)pDVar2,
                       "  jspb.Message.serializeBinaryExtensions(message, writer,\n    $extobj$Binary, $class$.prototype.getExtension);\n"
                       ,"extobj",&local_78,"class",&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_78);
  }
  io::Printer::Print((Printer *)desc_local,"};\n\n\n");
  return;
}

Assistant:

void Generator::GenerateClassSerializeBinary(const GeneratorOptions& options,
                                             io::Printer* printer,
                                             const Descriptor* desc) const {
  printer->Print(
      "/**\n"
      " * Serializes the message to binary data (in protobuf wire format).\n"
      " * @return {!Uint8Array}\n"
      " */\n"
      "$class$.prototype.serializeBinary = function() {\n"
      "  var writer = new jspb.BinaryWriter();\n"
      "  $class$.serializeBinaryToWriter(this, writer);\n"
      "  return writer.getResultBuffer();\n"
      "};\n"
      "\n"
      "\n"
      "/**\n"
      " * Serializes the given message to binary data (in protobuf wire\n"
      " * format), writing to the given BinaryWriter.\n"
      " * @param {!$class$} message\n"
      " * @param {!jspb.BinaryWriter} writer\n"
      " */\n"
      "$class$.serializeBinaryToWriter = function(message, "
      "writer) {\n"
      "  var f = undefined;\n",
      "class", GetMessagePath(options, desc));

  for (int i = 0; i < desc->field_count(); i++) {
    if (!IgnoreField(desc->field(i))) {
      GenerateClassSerializeBinaryField(options, printer, desc->field(i));
    }
  }

  if (IsExtendable(desc)) {
    printer->Print(
        "  jspb.Message.serializeBinaryExtensions(message, writer,\n"
        "    $extobj$Binary, $class$.prototype.getExtension);\n",
        "extobj", JSExtensionsObjectName(options, desc->file(), desc),
        "class", GetMessagePath(options, desc));
  }

  printer->Print(
      "};\n"
      "\n"
      "\n");
}